

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O1

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewFuncEnd(LocationUpdater *this,BinaryLocation oldAddr)

{
  BinaryLocation BVar1;
  ulong uVar2;
  BinaryLocation BVar3;
  Function *pFVar4;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  
  pFVar4 = FuncAddrMap::getEnd(&this->oldFuncAddrMap,oldAddr);
  if (pFVar4 == (Function *)0x0) {
    BVar3 = 0;
  }
  else {
    uVar2 = (this->newLocations->functions)._M_h._M_bucket_count;
    uVar5 = (ulong)pFVar4 % uVar2;
    p_Var7 = (this->newLocations->functions)._M_h._M_buckets[uVar5];
    p_Var8 = (__node_base_ptr)0x0;
    if ((p_Var7 != (__node_base_ptr)0x0) &&
       (p_Var6 = p_Var7->_M_nxt, p_Var8 = p_Var7, pFVar4 != (Function *)p_Var7->_M_nxt[1]._M_nxt)) {
      while (p_Var7 = p_Var6, p_Var6 = p_Var7->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
        p_Var8 = (__node_base_ptr)0x0;
        if (((ulong)p_Var6[1]._M_nxt % uVar2 != uVar5) ||
           (p_Var8 = p_Var7, pFVar4 == (Function *)p_Var6[1]._M_nxt)) goto LAB_00c90222;
      }
      p_Var8 = (__node_base_ptr)0x0;
    }
LAB_00c90222:
    if (p_Var8 == (__node_base_ptr)0x0) {
      p_Var6 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var6 = p_Var8->_M_nxt;
    }
    BVar3 = 0;
    if (p_Var6 != (_Hash_node_base *)0x0) {
      BVar1 = (pFVar4->funcLocation).end;
      BVar3 = *(BinaryLocation *)&p_Var6[3]._M_nxt;
      if (BVar1 != oldAddr) {
        if (BVar1 - 1 != oldAddr) {
          handle_unreachable("invalid func end",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                             ,0x23b);
        }
        BVar3 = 0;
        if (p_Var6 != (_Hash_node_base *)0x0) {
          BVar3 = *(BinaryLocation *)&p_Var6[3]._M_nxt - 1;
        }
      }
    }
  }
  return BVar3;
}

Assistant:

BinaryLocation getNewFuncEnd(BinaryLocation oldAddr) const {
    if (auto* func = oldFuncAddrMap.getEnd(oldAddr)) {
      // The function might have been optimized away, check.
      auto iter = newLocations.functions.find(func);
      if (iter != newLocations.functions.end()) {
        auto oldLocations = func->funcLocation;
        auto newLocations = iter->second;
        if (oldAddr == oldLocations.end) {
          return newLocations.end;
        } else if (oldAddr == oldLocations.end - 1) {
          return newLocations.end - 1;
        } else {
          WASM_UNREACHABLE("invalid func end");
        }
      }
    }
    return 0;
  }